

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCoding.h
# Opt level: O1

ssize_t __thiscall
llbuild::basic::BinaryEncoder::write(BinaryEncoder *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  uchar local_14;
  uchar local_13;
  uchar local_12;
  uchar local_11;
  
  llvm::SmallVectorTemplateBase<unsigned_char,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_char,_true> *)this,&local_13);
  llvm::SmallVectorTemplateBase<unsigned_char,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_char,_true> *)this,&local_14);
  llvm::SmallVectorTemplateBase<unsigned_char,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_char,_true> *)this,&local_12);
  llvm::SmallVectorTemplateBase<unsigned_char,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_char,_true> *)this,&local_11);
  return extraout_RAX;
}

Assistant:

void write(uint32_t value) {
    write(uint16_t(value >> 0));
    write(uint16_t(value >> 16));
  }